

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  vfloat<4> vVar7;
  BVH *bvh;
  size_t sVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined8 uVar21;
  size_t sVar22;
  bool bVar23;
  uint uVar24;
  undefined4 uVar25;
  int iVar26;
  long lVar27;
  size_t sVar28;
  long lVar29;
  ulong uVar30;
  NodeRef root;
  long lVar31;
  uint uVar32;
  NodeRef *pNVar33;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar34;
  vint4 ai_2;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  vint4 bi_3;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vint4 bi_2;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  vint4 bi_1;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 ai_1;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  vint4 ai_3;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  vint4 bi;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  Precalculations pre;
  vbool<4> terminated;
  undefined1 local_3738 [16];
  float local_36b8;
  float fStack_36b4;
  float fStack_36b0;
  float fStack_36ac;
  float local_36a8;
  float fStack_36a4;
  float fStack_36a0;
  float fStack_369c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  uVar21 = mm_lookupmask_ps._8_8_;
  uVar20 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar51 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar52 = vpcmpeqd_avx(auVar51,(undefined1  [16])valid_i->field_0);
    auVar40 = ZEXT816(0) << 0x40;
    auVar9 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar40,5);
    auVar54 = auVar52 & auVar9;
    if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar54[0xf] < '\0')
    {
      auVar9 = vandps_avx(auVar9,auVar52);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar80._8_4_ = 0x7fffffff;
      auVar80._0_8_ = 0x7fffffff7fffffff;
      auVar80._12_4_ = 0x7fffffff;
      auVar52 = vandps_avx(auVar80,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar73._8_4_ = 0x219392ef;
      auVar73._0_8_ = 0x219392ef219392ef;
      auVar73._12_4_ = 0x219392ef;
      auVar52 = vcmpps_avx(auVar52,auVar73,1);
      auVar54 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar73,auVar52);
      auVar52 = vandps_avx(auVar80,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar52 = vcmpps_avx(auVar52,auVar73,1);
      auVar55 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar73,auVar52);
      auVar52 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar80);
      auVar52 = vcmpps_avx(auVar52,auVar73,1);
      auVar52 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar73,auVar52);
      auVar60 = vrcpps_avx(auVar54);
      auVar74._8_4_ = 0x3f800000;
      auVar74._0_8_ = 0x3f8000003f800000;
      auVar74._12_4_ = 0x3f800000;
      auVar54 = vfnmadd213ps_fma(auVar54,auVar60,auVar74);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar54,auVar60,auVar60)
      ;
      auVar54 = vrcpps_avx(auVar55);
      auVar55 = vfnmadd213ps_fma(auVar55,auVar54,auVar74);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar55,auVar54,auVar54)
      ;
      auVar54 = vrcpps_avx(auVar52);
      auVar52 = vfnmadd213ps_fma(auVar52,auVar54,auVar74);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar52,auVar54,auVar54)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * (float)tray.org.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * (float)tray.org.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * (float)tray.org.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * (float)tray.org.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar52 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar40,1);
      auVar54._8_4_ = 0x20;
      auVar54._0_8_ = 0x2000000020;
      auVar54._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar52,auVar54);
      auVar52 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar40,5);
      auVar55._8_4_ = 0x40;
      auVar55._0_8_ = 0x4000000040;
      auVar55._12_4_ = 0x40;
      auVar60._8_4_ = 0x60;
      auVar60._0_8_ = 0x6000000060;
      auVar60._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar60,auVar55,auVar52);
      auVar52 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar40,5);
      auVar61._8_4_ = 0x80;
      auVar61._0_8_ = 0x8000000080;
      auVar61._12_4_ = 0x80;
      auVar65._8_4_ = 0xa0;
      auVar65._0_8_ = 0xa0000000a0;
      auVar65._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar65,auVar61,auVar52);
      auVar52 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar40);
      auVar54 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar40);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar76 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar52,auVar9);
      auVar48 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar52._8_4_ = 0xff800000;
      auVar52._0_8_ = 0xff800000ff800000;
      auVar52._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar52,auVar54,auVar9);
      terminated.field_0.i[1] = auVar9._4_4_ ^ auVar51._4_4_;
      terminated.field_0.i[0] = auVar9._0_4_ ^ auVar51._0_4_;
      terminated.field_0.i[2] = auVar9._8_4_ ^ auVar51._8_4_;
      terminated.field_0.i[3] = auVar9._12_4_ ^ auVar51._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar32 = 3;
      }
      else {
        uVar32 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar33 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar34 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_0163137c:
      do {
        do {
          root.ptr = pNVar33[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01631a3e;
          pNVar33 = pNVar33 + -1;
          paVar34 = paVar34 + -1;
          vVar7.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar34->v;
          auVar79 = ZEXT1664((undefined1  [16])vVar7.field_0);
          auVar51 = vcmpps_avx((undefined1  [16])vVar7.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar24 = vmovmskps_avx(auVar51);
        } while (uVar24 == 0);
        uVar30 = (ulong)(uVar24 & 0xff);
        uVar24 = POPCOUNT(uVar24 & 0xff);
        if (uVar32 < uVar24) {
LAB_016313bb:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01631a3e;
              auVar51 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar79._0_16_,6);
              if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar51 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar51[0xf]) goto LAB_0163137c;
              local_3738._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              local_3738._8_4_ = terminated.field_0.i[2] ^ 0xffffffff;
              local_3738._12_4_ = terminated.field_0.i[3] ^ 0xffffffff;
              uVar14 = *(undefined8 *)(ray + 0x50);
              auVar51 = *(undefined1 (*) [16])(ray + 0x50);
              uVar15 = *(undefined8 *)(ray + 0x60);
              uVar16 = *(undefined8 *)(ray + 0x40);
              auVar52 = *(undefined1 (*) [16])(ray + 0x40);
              lVar31 = (root.ptr & 0xfffffffffffffff0) + 0x90;
              lVar27 = 0;
              goto LAB_01631632;
            }
            sVar28 = 8;
            auVar51 = auVar76._0_16_;
            for (lVar27 = 0;
                (auVar79 = ZEXT1664(auVar51), lVar27 != 8 &&
                (sVar8 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar27 * 8), sVar8 != 8));
                lVar27 = lVar27 + 1) {
              uVar25 = *(undefined4 *)(root.ptr + 0x40 + lVar27 * 4);
              auVar41._4_4_ = uVar25;
              auVar41._0_4_ = uVar25;
              auVar41._8_4_ = uVar25;
              auVar41._12_4_ = uVar25;
              auVar17._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar17._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar17._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar17._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar55 = vfmsub213ps_fma(auVar41,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar17);
              uVar25 = *(undefined4 *)(root.ptr + 0x80 + lVar27 * 4);
              auVar62._4_4_ = uVar25;
              auVar62._0_4_ = uVar25;
              auVar62._8_4_ = uVar25;
              auVar62._12_4_ = uVar25;
              auVar18._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar18._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar18._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar18._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar60 = vfmsub213ps_fma(auVar62,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar18);
              uVar25 = *(undefined4 *)(root.ptr + 0xc0 + lVar27 * 4);
              auVar67._4_4_ = uVar25;
              auVar67._0_4_ = uVar25;
              auVar67._8_4_ = uVar25;
              auVar67._12_4_ = uVar25;
              auVar19._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar19._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar19._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar19._12_4_ = tray.org_rdir.field_0._44_4_;
              auVar61 = vfmsub213ps_fma(auVar67,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar19);
              uVar25 = *(undefined4 *)(root.ptr + 0x60 + lVar27 * 4);
              auVar71._4_4_ = uVar25;
              auVar71._0_4_ = uVar25;
              auVar71._8_4_ = uVar25;
              auVar71._12_4_ = uVar25;
              auVar65 = vfmsub213ps_fma(auVar71,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar17);
              uVar25 = *(undefined4 *)(root.ptr + 0xa0 + lVar27 * 4);
              auVar56._4_4_ = uVar25;
              auVar56._0_4_ = uVar25;
              auVar56._8_4_ = uVar25;
              auVar56._12_4_ = uVar25;
              auVar73 = vfmsub213ps_fma(auVar56,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar18);
              uVar25 = *(undefined4 *)(root.ptr + 0xe0 + lVar27 * 4);
              auVar49._4_4_ = uVar25;
              auVar49._0_4_ = uVar25;
              auVar49._8_4_ = uVar25;
              auVar49._12_4_ = uVar25;
              auVar74 = vfmsub213ps_fma(auVar49,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar19);
              auVar52 = vpminsd_avx(auVar55,auVar65);
              auVar54 = vpminsd_avx(auVar60,auVar73);
              auVar52 = vpmaxsd_avx(auVar52,auVar54);
              auVar54 = vpminsd_avx(auVar61,auVar74);
              auVar40 = vpmaxsd_avx(auVar52,auVar54);
              auVar52 = vpmaxsd_avx(auVar55,auVar65);
              auVar54 = vpmaxsd_avx(auVar60,auVar73);
              auVar54 = vpminsd_avx(auVar52,auVar54);
              auVar52 = vpmaxsd_avx(auVar61,auVar74);
              auVar54 = vpminsd_avx(auVar54,auVar52);
              auVar52 = vpmaxsd_avx(auVar40,(undefined1  [16])tray.tnear.field_0);
              auVar54 = vpminsd_avx(auVar54,(undefined1  [16])tray.tfar.field_0);
              auVar54 = vcmpps_avx(auVar52,auVar54,2);
              auVar48 = ZEXT1664(auVar54);
              sVar22 = sVar28;
              auVar52 = auVar51;
              if (((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar54[0xf] < '\0') &&
                 (auVar52 = vblendvps_avx(auVar76._0_16_,auVar40,auVar54), sVar22 = sVar8,
                 sVar28 != 8)) {
                pNVar33->ptr = sVar28;
                pNVar33 = pNVar33 + 1;
                *(undefined1 (*) [16])paVar34->v = auVar51;
                paVar34 = paVar34 + 1;
              }
              auVar51 = auVar52;
              sVar28 = sVar22;
            }
            if (sVar28 == 8) goto LAB_0163153b;
            auVar52 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar51,6);
            uVar25 = vmovmskps_avx(auVar52);
            root.ptr = sVar28;
          } while ((byte)uVar32 < (byte)POPCOUNT(uVar25));
          pNVar33->ptr = sVar28;
          pNVar33 = pNVar33 + 1;
          *(undefined1 (*) [16])paVar34->v = auVar51;
          paVar34 = paVar34 + 1;
LAB_0163153b:
          iVar26 = 4;
        }
        else {
          while (uVar30 != 0) {
            sVar28 = 0;
            for (uVar13 = uVar30; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
              sVar28 = sVar28 + 1;
            }
            uVar30 = uVar30 - 1 & uVar30;
            bVar23 = occluded1(This,bvh,root,sVar28,&pre,ray,&tray,context);
            if (bVar23) {
              terminated.field_0.i[sVar28] = -1;
            }
          }
          auVar51 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar26 = 3;
          auVar76 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar79 = ZEXT1664((undefined1  [16])vVar7.field_0);
          if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar51[0xf] < '\0') {
            auVar48 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar51._8_4_ = 0xff800000;
            auVar51._0_8_ = 0xff800000ff800000;
            auVar51._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar51,
                               (undefined1  [16])terminated.field_0);
            iVar26 = 2;
          }
          if (uVar32 < uVar24) goto LAB_016313bb;
        }
      } while (iVar26 != 3);
LAB_01631a3e:
      auVar9 = vandps_avx(auVar9,(undefined1  [16])terminated.field_0);
      auVar47._8_4_ = 0xff800000;
      auVar47._0_8_ = 0xff800000ff800000;
      auVar47._12_4_ = 0xff800000;
      auVar9 = vmaskmovps_avx(auVar9,auVar47);
      *(undefined1 (*) [16])(ray + 0x80) = auVar9;
    }
  }
  return;
LAB_01631632:
  do {
    auVar54 = auVar48._0_16_;
    if (lVar27 == (ulong)((uint)root.ptr & 0xf) - 8) break;
    lVar29 = -0x10;
    auVar40 = local_3738;
    do {
      if ((lVar29 == 0) || (uVar30 = (ulong)*(uint *)(lVar31 + 0x10 + lVar29), uVar30 == 0xffffffff)
         ) break;
      uVar25 = *(undefined4 *)(lVar31 + -0x80 + lVar29);
      auVar35._4_4_ = uVar25;
      auVar35._0_4_ = uVar25;
      auVar35._8_4_ = uVar25;
      auVar35._12_4_ = uVar25;
      auVar55 = vsubps_avx(auVar35,*(undefined1 (*) [16])ray);
      uVar25 = *(undefined4 *)(lVar31 + -0x70 + lVar29);
      auVar36._4_4_ = uVar25;
      auVar36._0_4_ = uVar25;
      auVar36._8_4_ = uVar25;
      auVar36._12_4_ = uVar25;
      auVar60 = vsubps_avx(auVar36,*(undefined1 (*) [16])(ray + 0x10));
      uVar25 = *(undefined4 *)(lVar31 + -0x60 + lVar29);
      auVar37._4_4_ = uVar25;
      auVar37._0_4_ = uVar25;
      auVar37._8_4_ = uVar25;
      auVar37._12_4_ = uVar25;
      auVar61 = vsubps_avx(auVar37,*(undefined1 (*) [16])(ray + 0x20));
      fVar1 = *(float *)(lVar31 + -0x50 + lVar29);
      auVar42._4_4_ = fVar1;
      auVar42._0_4_ = fVar1;
      auVar42._8_4_ = fVar1;
      auVar42._12_4_ = fVar1;
      fVar2 = *(float *)(lVar31 + -0x40 + lVar29);
      auVar68._4_4_ = fVar2;
      auVar68._0_4_ = fVar2;
      auVar68._8_4_ = fVar2;
      auVar68._12_4_ = fVar2;
      fVar3 = *(float *)(lVar31 + -0x30 + lVar29);
      auVar57._4_4_ = fVar3;
      auVar57._0_4_ = fVar3;
      auVar57._8_4_ = fVar3;
      auVar57._12_4_ = fVar3;
      fVar4 = *(float *)(lVar31 + -0x20 + lVar29);
      auVar77._4_4_ = fVar4;
      auVar77._0_4_ = fVar4;
      auVar77._8_4_ = fVar4;
      auVar77._12_4_ = fVar4;
      fVar5 = *(float *)(lVar31 + -0x10 + lVar29);
      auVar63._4_4_ = fVar5;
      auVar63._0_4_ = fVar5;
      auVar63._8_4_ = fVar5;
      auVar63._12_4_ = fVar5;
      fVar6 = *(float *)(lVar31 + lVar29);
      auVar81._4_4_ = fVar6;
      auVar81._0_4_ = fVar6;
      auVar81._8_4_ = fVar6;
      auVar81._12_4_ = fVar6;
      fVar2 = fVar6 * fVar2;
      auVar66._4_4_ = fVar2;
      auVar66._0_4_ = fVar2;
      auVar66._8_4_ = fVar2;
      auVar66._12_4_ = fVar2;
      auVar74 = vfmsub231ps_fma(auVar66,auVar63,auVar57);
      fVar4 = fVar4 * fVar3;
      auVar75._4_4_ = fVar4;
      auVar75._0_4_ = fVar4;
      auVar75._8_4_ = fVar4;
      auVar75._12_4_ = fVar4;
      auVar35 = vfmsub231ps_fma(auVar75,auVar81,auVar42);
      fVar1 = fVar1 * fVar5;
      auVar43._4_4_ = fVar1;
      auVar43._0_4_ = fVar1;
      auVar43._8_4_ = fVar1;
      auVar43._12_4_ = fVar1;
      auVar36 = vfmsub231ps_fma(auVar43,auVar77,auVar68);
      auVar69._0_4_ = (float)uVar14 * auVar61._0_4_;
      auVar69._4_4_ = (float)((ulong)uVar14 >> 0x20) * auVar61._4_4_;
      auVar69._8_4_ = (float)*(undefined8 *)(ray + 0x58) * auVar61._8_4_;
      auVar69._12_4_ = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20) * auVar61._12_4_;
      auVar37 = vfmsub231ps_fma(auVar69,auVar60,*(undefined1 (*) [16])(ray + 0x60));
      fVar1 = (float)uVar15;
      auVar70._0_4_ = auVar55._0_4_ * fVar1;
      fVar2 = (float)((ulong)uVar15 >> 0x20);
      auVar70._4_4_ = auVar55._4_4_ * fVar2;
      fVar4 = (float)*(undefined8 *)(ray + 0x68);
      auVar70._8_4_ = auVar55._8_4_ * fVar4;
      fVar5 = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
      auVar70._12_4_ = auVar55._12_4_ * fVar5;
      auVar43 = vfmsub231ps_fma(auVar70,auVar61,auVar52);
      auVar72._0_4_ = (float)uVar16 * auVar60._0_4_;
      auVar72._4_4_ = (float)((ulong)uVar16 >> 0x20) * auVar60._4_4_;
      auVar72._8_4_ = (float)*(undefined8 *)(ray + 0x48) * auVar60._8_4_;
      auVar72._12_4_ = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20) * auVar60._12_4_;
      auVar57 = vfmsub231ps_fma(auVar72,auVar55,auVar51);
      auVar38._0_4_ = auVar36._0_4_ * fVar1;
      auVar38._4_4_ = auVar36._4_4_ * fVar2;
      auVar38._8_4_ = auVar36._8_4_ * fVar4;
      auVar38._12_4_ = auVar36._12_4_ * fVar5;
      auVar54 = vfmadd231ps_fma(auVar38,auVar35,auVar51);
      auVar73 = vfmadd231ps_fma(auVar54,auVar74,auVar52);
      auVar82._0_4_ = fVar6 * auVar57._0_4_;
      auVar82._4_4_ = fVar6 * auVar57._4_4_;
      auVar82._8_4_ = fVar6 * auVar57._8_4_;
      auVar82._12_4_ = fVar6 * auVar57._12_4_;
      auVar65 = vfmadd231ps_fma(auVar82,auVar43,auVar63);
      auVar64._8_4_ = 0x80000000;
      auVar64._0_8_ = 0x8000000080000000;
      auVar64._12_4_ = 0x80000000;
      auVar54 = vandps_avx(auVar73,auVar64);
      auVar65 = vfmadd231ps_fma(auVar65,auVar37,auVar77);
      uVar24 = auVar54._0_4_;
      auVar83._0_4_ = auVar65._0_4_ ^ uVar24;
      uVar10 = auVar54._4_4_;
      auVar83._4_4_ = auVar65._4_4_ ^ uVar10;
      uVar11 = auVar54._8_4_;
      auVar83._8_4_ = auVar65._8_4_ ^ uVar11;
      uVar12 = auVar54._12_4_;
      auVar83._12_4_ = auVar65._12_4_ ^ uVar12;
      auVar38 = ZEXT816(0) << 0x20;
      auVar54 = vcmpps_avx(auVar83,auVar38,5);
      auVar65 = auVar40 & auVar54;
      auVar78._8_8_ = uVar21;
      auVar78._0_8_ = uVar20;
      if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar65[0xf] < '\0'
         ) {
        auVar54 = vandps_avx(auVar54,auVar40);
        auVar58._0_4_ = auVar57._0_4_ * fVar3;
        auVar58._4_4_ = auVar57._4_4_ * fVar3;
        auVar58._8_4_ = auVar57._8_4_ * fVar3;
        auVar58._12_4_ = auVar57._12_4_ * fVar3;
        auVar65 = vfmadd132ps_fma(auVar43,auVar58,auVar68);
        auVar65 = vfmadd132ps_fma(auVar37,auVar65,auVar42);
        auVar53._0_4_ = uVar24 ^ auVar65._0_4_;
        auVar53._4_4_ = uVar10 ^ auVar65._4_4_;
        auVar53._8_4_ = uVar11 ^ auVar65._8_4_;
        auVar53._12_4_ = uVar12 ^ auVar65._12_4_;
        auVar65 = vcmpps_avx(auVar53,auVar38,5);
        auVar37 = auVar54 & auVar65;
        if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar37[0xf] < '\0') {
          auVar37 = vandps_avx(auVar73,auVar80);
          auVar54 = vandps_avx(auVar54,auVar65);
          auVar65 = vsubps_avx(auVar37,auVar83);
          auVar65 = vcmpps_avx(auVar65,auVar53,5);
          auVar43 = auVar54 & auVar65;
          if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar43[0xf] < '\0') {
            auVar54 = vandps_avx(auVar65,auVar54);
            auVar44._0_4_ = auVar36._0_4_ * auVar61._0_4_;
            auVar44._4_4_ = auVar36._4_4_ * auVar61._4_4_;
            auVar44._8_4_ = auVar36._8_4_ * auVar61._8_4_;
            auVar44._12_4_ = auVar36._12_4_ * auVar61._12_4_;
            auVar60 = vfmadd213ps_fma(auVar60,auVar35,auVar44);
            auVar55 = vfmadd213ps_fma(auVar55,auVar74,auVar60);
            auVar45._0_4_ = uVar24 ^ auVar55._0_4_;
            auVar45._4_4_ = uVar10 ^ auVar55._4_4_;
            auVar45._8_4_ = uVar11 ^ auVar55._8_4_;
            auVar45._12_4_ = uVar12 ^ auVar55._12_4_;
            local_36a8 = (float)*(undefined8 *)(ray + 0x30);
            fStack_36a4 = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
            fStack_36a0 = (float)*(undefined8 *)(ray + 0x38);
            fStack_369c = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
            auVar59._0_4_ = auVar37._0_4_ * local_36a8;
            auVar59._4_4_ = auVar37._4_4_ * fStack_36a4;
            auVar59._8_4_ = auVar37._8_4_ * fStack_36a0;
            auVar59._12_4_ = auVar37._12_4_ * fStack_369c;
            auVar55 = vcmpps_avx(auVar59,auVar45,1);
            local_36b8 = (float)*(undefined8 *)(ray + 0x80);
            fStack_36b4 = (float)((ulong)*(undefined8 *)(ray + 0x80) >> 0x20);
            fStack_36b0 = (float)*(undefined8 *)(ray + 0x88);
            fStack_36ac = (float)((ulong)*(undefined8 *)(ray + 0x88) >> 0x20);
            auVar50._0_4_ = auVar37._0_4_ * local_36b8;
            auVar50._4_4_ = auVar37._4_4_ * fStack_36b4;
            auVar50._8_4_ = auVar37._8_4_ * fStack_36b0;
            auVar50._12_4_ = auVar37._12_4_ * fStack_36ac;
            auVar60 = vcmpps_avx(auVar45,auVar50,2);
            auVar55 = vandps_avx(auVar60,auVar55);
            auVar60 = auVar54 & auVar55;
            if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar60[0xf] < '\0') {
              auVar54 = vandps_avx(auVar55,auVar54);
              auVar55 = vcmpps_avx(auVar38,auVar73,4);
              auVar60 = auVar54 & auVar55;
              if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar60[0xf]) {
              }
              else {
                auVar78 = vandps_avx(auVar55,auVar54);
              }
            }
          }
        }
      }
      uVar24 = ((context->scene->geometries).items[uVar30].ptr)->mask;
      auVar39._4_4_ = uVar24;
      auVar39._0_4_ = uVar24;
      auVar39._8_4_ = uVar24;
      auVar39._12_4_ = uVar24;
      auVar54 = vpand_avx(auVar39,*(undefined1 (*) [16])(ray + 0x90));
      auVar54 = vpcmpeqd_avx(auVar38,auVar54);
      auVar55 = auVar78 & ~auVar54;
      if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar55[0xf] < '\0'
         ) {
        auVar54 = vandnps_avx(auVar54,auVar78);
        auVar40 = vandnps_avx(auVar54,auVar40);
      }
      auVar76 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      lVar29 = lVar29 + 4;
    } while ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar40[0xf] < '\0');
    auVar48 = ZEXT1664(local_3738);
    auVar55 = vandps_avx(auVar40,local_3738);
    lVar27 = lVar27 + 1;
    lVar31 = lVar31 + 0xb0;
    auVar40 = local_3738 & auVar40;
    auVar54 = local_3738;
    local_3738 = auVar55;
  } while ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar40[0xf] < '\0');
  auVar51 = vpcmpeqd_avx(auVar54,auVar54);
  auVar40._0_4_ = local_3738._0_4_ ^ auVar51._0_4_;
  auVar40._4_4_ = local_3738._4_4_ ^ auVar51._4_4_;
  auVar40._8_4_ = local_3738._8_4_ ^ auVar51._8_4_;
  auVar40._12_4_ = local_3738._12_4_ ^ auVar51._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar40,(undefined1  [16])terminated.field_0);
  auVar51 = auVar51 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar51 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar51[0xf])
  goto LAB_01631a3e;
  auVar46._8_4_ = 0xff800000;
  auVar46._0_8_ = 0xff800000ff800000;
  auVar46._12_4_ = 0xff800000;
  auVar48 = ZEXT1664(auVar46);
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar46,
                     (undefined1  [16])terminated.field_0);
  goto LAB_0163137c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }